

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O3

bool __thiscall
QPDFObjectHandle::isDictionaryOfType(QPDFObjectHandle *this,string *type,string *subtype)

{
  size_type sVar1;
  bool bVar2;
  QPDFObjectHandle local_80;
  QPDFObjectHandle local_70;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  bVar2 = isDictionary(this);
  if (!bVar2) {
    return false;
  }
  sVar1 = type->_M_string_length;
  if (sVar1 == 0) {
    if (subtype->_M_string_length == 0) {
      return true;
    }
  }
  else {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"/Type","");
    getKey(&local_70,(string *)this);
    bVar2 = isNameAndEquals(&local_70,type);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_001c27a7;
    }
    if (subtype->_M_string_length == 0) {
      bVar2 = true;
      goto LAB_001c27a7;
    }
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"/Subtype","");
  getKey(&local_80,(string *)this);
  bVar2 = isNameAndEquals(&local_80,subtype);
  if (local_80.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (sVar1 == 0) {
    return bVar2;
  }
LAB_001c27a7:
  if (local_70.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_70.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return bVar2;
}

Assistant:

bool
QPDFObjectHandle::isDictionaryOfType(std::string const& type, std::string const& subtype) const
{
    return isDictionary() && (type.empty() || getKey("/Type").isNameAndEquals(type)) &&
        (subtype.empty() || getKey("/Subtype").isNameAndEquals(subtype));
}